

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-writer.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_1::WatWriter::ExprVisitorDelegate::OnDelegateExpr
          (ExprVisitorDelegate *this,TryExpr *expr)

{
  WatWriter *this_00;
  char *s;
  TryExpr *expr_local;
  ExprVisitorDelegate *this_local;
  
  Dedent(this->writer_);
  ModuleContext::EndBlock(&this->writer_->super_ModuleContext);
  this_00 = this->writer_;
  s = Opcode::GetName((Opcode *)&Opcode::Delegate_Opcode);
  WritePutsSpace(this_00,s);
  WriteVar(this->writer_,&expr->delegate_target,Newline);
  Result::Result((Result *)((long)&this_local + 4),Ok);
  return (Result)this_local._4_4_;
}

Assistant:

Result WatWriter::ExprVisitorDelegate::OnDelegateExpr(TryExpr* expr) {
  writer_->Dedent();
  writer_->EndBlock();
  writer_->WritePutsSpace(Opcode::Delegate_Opcode.GetName());
  writer_->WriteVar(expr->delegate_target, NextChar::Newline);
  return Result::Ok;
}